

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

AActor * P_OldSpawnMissile(AActor *source,AActor *owner,AActor *dest,PClassActor *type)

{
  BYTE BVar1;
  AActor *missile;
  double dVar2;
  _func_int **local_48;
  PClass *pPStack_40;
  DObject *local_38;
  
  if (type == (PClassActor *)0x0 || source == (AActor *)0x0) {
    missile = (AActor *)0x0;
  }
  else {
    local_38 = (DObject *)((source->__Pos).Z + 32.0);
    local_48 = (_func_int **)(source->__Pos).X;
    pPStack_40 = (PClass *)(source->__Pos).Y;
    missile = Spawn(type,(DVector3 *)&stack0xffffffffffffffb8,ALLOW_REPLACE);
    P_PlaySpawnSound(missile,source);
    (missile->target).field_0.p = owner;
    AActor::AngleTo((AActor *)&stack0xffffffffffffffb8,source,SUB81(dest,0));
    (missile->Angles).Yaw.Degrees = (double)local_48;
    AActor::VelFromAngle(missile);
    dVar2 = 1.0;
    if (1.0 <= missile->Speed) {
      dVar2 = missile->Speed;
    }
    dVar2 = AActor::DistanceBySpeed(source,dest,dVar2);
    (missile->Vel).Z = ((dest->__Pos).Z - (source->__Pos).Z) / dVar2;
    if (((missile->flags4).Value & 0x40000) != 0) {
      if (owner->player == (player_t *)0x0) {
        BVar1 = '\0';
      }
      else {
        BVar1 = (char)((long)&owner->player[-0x916e].morphTics / 0x2a0) + '\x01';
      }
      missile->FriendPlayer = BVar1;
    }
    P_CheckMissileSpawn(missile,source->radius);
  }
  return missile;
}

Assistant:

AActor *P_OldSpawnMissile(AActor *source, AActor *owner, AActor *dest, PClassActor *type)
{
	if (source == nullptr || type == nullptr)
	{
		return nullptr;
	}
	AActor *th = Spawn (type, source->PosPlusZ(32.), ALLOW_REPLACE);

	P_PlaySpawnSound(th, source);
	th->target = owner;		// record missile's originator

	th->Angles.Yaw = source->AngleTo(dest);
	th->VelFromAngle();


	double dist = source->DistanceBySpeed(dest, MAX(1., th->Speed));
	th->Vel.Z = (dest->Z() - source->Z()) / dist;

	if (th->flags4 & MF4_SPECTRAL)
	{
		th->SetFriendPlayer(owner->player);
	}

	P_CheckMissileSpawn(th, source->radius);
	return th;
}